

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

clock_t __thiscall lest::times::~times(times *this,tms *__buffer)

{
  pointer pcVar1;
  long lVar2;
  ostream *poVar3;
  clock_t extraout_RAX;
  clock_t extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined1 auVar5 [16];
  timeval t;
  timeval local_28;
  
  poVar3 = (this->super_action).os;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Elapsed time: ",0xe);
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 8) = 1;
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  lVar2 = (local_28.tv_sec * 1000000 + local_28.tv_usec) - (this->total).start_ticks;
  auVar5._8_4_ = (int)((ulong)lVar2 >> 0x20);
  auVar5._0_8_ = lVar2;
  auVar5._12_4_ = 0x45300000;
  poVar3 = std::ostream::_M_insert<double>
                     (((auVar5._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) / 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," s\n",3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->output).ctx);
  pcVar1 = (this->output).testing._M_dataplus._M_p;
  paVar4 = &(this->output).testing.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar4) {
    operator_delete(pcVar1,paVar4->_M_allocated_capacity + 1);
    return extraout_RAX_00;
  }
  return extraout_RAX;
}

Assistant:

~times()
    {
        os << "Elapsed time: " << std::setprecision(1) << total.elapsed_seconds() << " s\n";
    }